

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::FeaturesDebugStringTest_RoundTrip_Test::
~FeaturesDebugStringTest_RoundTrip_Test(FeaturesDebugStringTest_RoundTrip_Test *this)

{
  unique_ptr<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
  *this_00;
  
  this_00 = &this[-1].super_FeaturesDebugStringTest.super_FeaturesTest.super_FeaturesBaseTest.pool_.
             feature_set_defaults_spec_;
  this[-1].super_FeaturesDebugStringTest.super_FeaturesTest.super_FeaturesBaseTest.pool_.
  feature_set_defaults_spec_._M_t.
  super___uniq_ptr_impl<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
  .super__Head_base<0UL,_google::protobuf::FeatureSetDefaults_*,_false>._M_head_impl =
       (FeatureSetDefaults *)&PTR__FeaturesDebugStringTest_018e7828;
  (this->super_FeaturesDebugStringTest).super_FeaturesTest.super_FeaturesBaseTest.super_Test.
  _vptr_Test = (_func_int **)&DAT_018e7868;
  DescriptorPool::~DescriptorPool
            ((DescriptorPool *)
             &(this->super_FeaturesDebugStringTest).super_FeaturesTest.super_FeaturesBaseTest.
              super_Test.gtest_flag_saver_);
  this[-1].super_FeaturesDebugStringTest.super_FeaturesTest.super_FeaturesBaseTest.pool_.
  feature_set_defaults_spec_._M_t.
  super___uniq_ptr_impl<google::protobuf::FeatureSetDefaults,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::FeatureSetDefaults_*,_std::default_delete<google::protobuf::FeatureSetDefaults>_>
  .super__Head_base<0UL,_google::protobuf::FeatureSetDefaults_*,_false>._M_head_impl =
       (FeatureSetDefaults *)&PTR__ValidationErrorTest_018e2b28;
  DescriptorPool::~DescriptorPool(&this[-1].super_FeaturesDebugStringTest.roundtrip_pool_);
  testing::Test::~Test((Test *)this_00);
  operator_delete(this_00,0x108);
  return;
}

Assistant:

TEST_P(FeaturesDebugStringTest, RoundTrip) {
  BuildDescriptorMessagesInTestPool();
  BuildFileInTestPool(pb::TestFeatures::descriptor()->file());
  const FileDescriptor* file = BuildFile(GetFileProto());
  ASSERT_THAT(file, NotNull());

  LoadFile("google/protobuf/descriptor.proto",
           DescriptorProto::GetDescriptor()->file()->DebugString());
  LoadFile("google/protobuf/unittest_features.proto",
           pb::TestFeatures::GetDescriptor()->file()->DebugString());
  const FileDescriptor* roundtripped =
      LoadFile(file->name(), file->DebugString());

  FileDescriptorProto roundtripped_proto;
  roundtripped->CopyTo(&roundtripped_proto);
  EXPECT_THAT(roundtripped_proto, EqualsRoundTrip())
      << "With generated proto file: \n"
      << file->DebugString();
}